

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O0

Matrix3f * __thiscall Matrix4f::getSubmatrix3x3(Matrix4f *this,int i0,int j0)

{
  float fVar1;
  float *pfVar2;
  int in_ECX;
  int in_EDX;
  Matrix4f *in_RSI;
  Matrix3f *in_RDI;
  int j;
  int i;
  Matrix3f *out;
  undefined4 local_20;
  undefined4 local_1c;
  
  Matrix3f::Matrix3f(in_RDI,0.0);
  for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < 3; local_20 = local_20 + 1) {
      pfVar2 = operator()(in_RSI,local_1c + in_EDX,local_20 + in_ECX);
      fVar1 = *pfVar2;
      pfVar2 = Matrix3f::operator()(in_RDI,local_1c,local_20);
      *pfVar2 = fVar1;
    }
  }
  return in_RDI;
}

Assistant:

Matrix3f Matrix4f::getSubmatrix3x3( int i0, int j0 ) const
{
	Matrix3f out;

	for( int i = 0; i < 3; ++i )
	{
		for( int j = 0; j < 3; ++j )
		{
			out( i, j ) = ( *this )( i + i0, j + j0 );
		}
	}

	return out;
}